

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

int aom_decode_frame_from_obus(AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end)

{
  uint8_t uVar1;
  aom_codec_err_t aVar2;
  int iVar3;
  uint32_t uVar4;
  aom_read_bit_buffer *rb_00;
  undefined8 *in_RCX;
  AV1_COMMON *cm_00;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  AV1Decoder *in_RDI;
  uint8_t padding_byte;
  aom_codec_err_t status;
  size_t bytes_available;
  size_t bytes_read;
  size_t obu_payload_offset;
  size_t decoded_payload_size;
  size_t payload_size;
  aom_read_bit_buffer rb;
  ObuHeader obu_header;
  uint32_t frame_header_size;
  uint8_t *frame_header;
  int is_first_tg_obu_received;
  int frame_decoding_finished;
  AV1_COMMON *cm;
  aom_read_bit_buffer *in_stack_000006e0;
  AV1Decoder *in_stack_000006e8;
  AV1_COMMON *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff43;
  AV1Decoder *pbi_00;
  AV1Decoder *pAVar6;
  AV1Decoder *rb_01;
  AV1Decoder *sz;
  AV1Decoder *pbi_01;
  size_t *in_stack_ffffffffffffff70;
  uint8_t **in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  aom_read_bit_buffer *in_stack_ffffffffffffff90;
  AV1Decoder *in_stack_ffffffffffffff98;
  OBU_TYPE local_60;
  int local_54;
  int local_50;
  uint local_44;
  uint8_t *local_40;
  undefined1 local_34 [12];
  undefined8 *local_28;
  uint8_t *local_20;
  uint8_t *local_18;
  AV1Decoder *local_10;
  
  local_34._4_8_ = &in_RDI->common;
  local_34._0_4_ = 0;
  local_44 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffff98,0,0x20);
  local_10->seen_frame_header = 0;
  local_10->next_start_tile = 0;
  local_10->num_tile_groups = 0;
  if (local_20 < local_18) {
    (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
  }
  else {
    local_40 = in_RSI;
    if (((CommonTileParams *)(local_34._4_8_ + 0x60a0))->large_scale == 0) {
      local_10->camera_frame_header_ready = 0;
    }
LAB_001d301e:
    uVar5 = false;
    if (local_34._0_4_ == 0) {
      uVar5 = (local_10->error).error_code == AOM_CODEC_OK;
    }
    if ((bool)uVar5 == false) {
LAB_001d39e5:
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
      return local_34._0_4_;
    }
    sz = (AV1Decoder *)0x0;
    rb_01 = (AV1Decoder *)0x0;
    pAVar6 = (AV1Decoder *)0x0;
    pbi_00 = (AV1Decoder *)0x0;
    rb_00 = (aom_read_bit_buffer *)(local_20 + -(long)local_18);
    if ((rb_00 == (aom_read_bit_buffer *)0x0) && (local_10->seen_frame_header == 0)) {
      *local_28 = local_18;
      (local_10->error).error_code = AOM_CODEC_OK;
      goto LAB_001d39e5;
    }
    aVar2 = aom_read_obu_header_and_size
                      ((uint8_t *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff8c,
                       (ObuHeader *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (size_t *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (aVar2 != AOM_CODEC_OK) {
      (local_10->error).error_code = aVar2;
      return -1;
    }
    (local_10->obu_size_hdr).data = local_18 + (long)in_stack_ffffffffffffff98;
    (local_10->obu_size_hdr).size = (long)pbi_00 - (long)in_stack_ffffffffffffff98;
    local_18 = local_18 + (long)&pbi_00->dcb;
    if ((AV1Decoder *)(local_20 + -(long)local_18) < sz) {
      (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }
    *(int *)(local_34._4_8_ + 0x638c) = local_54;
    *(int *)(local_34._4_8_ + 0x6390) = local_50;
    if (((local_60 != OBU_TEMPORAL_DELIMITER) && (local_60 != OBU_SEQUENCE_HEADER)) &&
       (iVar3 = is_obu_in_current_operating_point(local_10,(ObuHeader *)&stack0xffffffffffffff98),
       iVar3 == 0)) {
      local_18 = local_18 + (long)&sz->dcb;
      goto LAB_001d301e;
    }
    av1_init_read_bit_buffer
              (local_10,(aom_read_bit_buffer *)&stack0xffffffffffffff70,local_18,local_18 + (long)sz
              );
    cm_00 = (AV1_COMMON *)(ulong)(local_60 - 1);
    pbi_01 = sz;
    switch(cm_00) {
    case (AV1_COMMON *)0x0:
      uVar4 = read_sequence_header_obu(in_stack_000006e8,in_stack_000006e0);
      sz = (AV1Decoder *)(ulong)uVar4;
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
      if ((local_10->sequence_header_changed != 0) && (local_10->seen_frame_header != 0)) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      break;
    case (AV1_COMMON *)0x1:
      uVar4 = read_temporal_delimiter_obu();
      sz = (AV1Decoder *)(ulong)uVar4;
      if (local_10->seen_frame_header != 0) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      break;
    case (AV1_COMMON *)0x2:
    case (AV1_COMMON *)0x5:
    case (AV1_COMMON *)0x6:
      if (local_60 == OBU_REDUNDANT_FRAME_HEADER) {
        if (local_10->seen_frame_header == 0) {
          (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
      }
      else if (local_10->seen_frame_header != 0) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      if ((local_10->seen_frame_header == 0) ||
         ((((CommonTileParams *)(local_34._4_8_ + 0x60a0))->large_scale != 0 &&
          (local_10->camera_frame_header_ready == 0)))) {
        local_44 = read_frame_header_obu
                             (pbi_00,rb_00,
                              (uint8_t *)
                              CONCAT44(aVar2,CONCAT13(in_stack_ffffffffffffff43,
                                                      CONCAT12(uVar5,in_stack_ffffffffffffff40))),
                              (uint8_t **)cm_00,in_stack_ffffffffffffff34);
        local_40 = local_18;
        local_10->seen_frame_header = 1;
        pbi_01 = sz;
        if ((local_10->ext_tile_debug == 0) &&
           (((CommonTileParams *)(local_34._4_8_ + 0x60a0))->large_scale != 0)) {
          local_10->camera_frame_header_ready = 1;
        }
      }
      else {
        if ((sz < (AV1Decoder *)(ulong)local_44) ||
           (iVar3 = memcmp(local_18,local_40,(ulong)local_44), iVar3 != 0)) {
          (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        in_stack_ffffffffffffff80 = local_44 << 3;
        pbi_01 = sz;
      }
      sz = (AV1Decoder *)(ulong)local_44;
      local_10->frame_header_size = (ulong)local_44;
      (*(RefCntBuffer **)(local_34._4_8_ + 0xe8))->temporal_id = local_54;
      (*(RefCntBuffer **)(local_34._4_8_ + 0xe8))->spatial_id = local_50;
      if (*(int *)(local_34._4_8_ + 0x1e8) == 0) {
        if ((local_10->ext_tile_debug == 0) && (local_10->camera_frame_header_ready != 0)) {
          local_34._0_4_ = 1;
          *local_28 = local_20;
          sz = pbi_01;
        }
        else if (local_60 == OBU_FRAME) {
          pAVar6 = (AV1Decoder *)(ulong)local_44;
          iVar3 = byte_alignment(in_stack_ffffffffffffff28,(aom_read_bit_buffer *)0x1d364f);
          rb_01 = sz;
          if (iVar3 != 0) {
            return -1;
          }
          goto switchD_001d3272_caseD_3;
        }
      }
      else {
        if (local_60 == OBU_FRAME) {
          (local_10->error).error_code = AOM_CODEC_UNSUP_BITSTREAM;
          return -1;
        }
        local_34._0_4_ = 1;
        local_10->seen_frame_header = 0;
        if ((*(int *)(local_34._4_8_ + 0x1e0) != 0) &&
           (((*(SequenceHeader **)(local_34._4_8_ + 0x6088))->order_hint_info).enable_order_hint ==
            0)) {
          ((CurrentFrame *)local_34._4_8_)->frame_number =
               ((CurrentFrame *)local_34._4_8_)->frame_number + 1;
        }
      }
      break;
    case (AV1_COMMON *)0x3:
switchD_001d3272_caseD_3:
      if (local_10->seen_frame_header == 0) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      if (pbi_01 < pAVar6) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      in_stack_ffffffffffffff28 = (AV1_COMMON *)local_34;
      in_stack_ffffffffffffff30 = (uint)(local_60 == OBU_FRAME);
      uVar4 = read_one_tile_group_obu
                        (pbi_01,(aom_read_bit_buffer *)rb_01,(int)((ulong)pAVar6 >> 0x20),
                         (uint8_t *)pbi_00,(uint8_t *)rb_00,
                         (uint8_t **)
                         CONCAT44(aVar2,CONCAT13(in_stack_ffffffffffffff43,
                                                 CONCAT12(uVar5,in_stack_ffffffffffffff40))),
                         (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff88);
      sz = (AV1Decoder *)((long)((rb_01->dcb).xd.plane[0].pre + -2) + (ulong)uVar4);
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
      if (local_34._0_4_ != 0) {
        local_10->seen_frame_header = 0;
        local_10->next_start_tile = 0;
      }
      local_10->num_tile_groups = local_10->num_tile_groups + 1;
      break;
    case (AV1_COMMON *)0x4:
      sz = (AV1Decoder *)
           read_metadata(in_stack_ffffffffffffff98,(uint8_t *)in_stack_ffffffffffffff90,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         SUB41(in_stack_ffffffffffffff84,3));
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
      break;
    case (AV1_COMMON *)0x7:
      if (local_10->camera_frame_header_ready == 0) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      ((CommonTileParams *)(local_34._4_8_ + 0x60a0))->large_scale = 1;
      av1_set_single_tile_decoding_mode((AV1_COMMON *)local_34._4_8_);
      pbi_01 = sz;
      uVar4 = read_and_decode_one_tile_list
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,(int *)in_stack_ffffffffffffff70);
      sz = (AV1Decoder *)(ulong)uVar4;
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
      break;
    default:
      if ((sz != (AV1Decoder *)0x0) &&
         (uVar1 = get_last_nonzero_byte(local_18,(size_t)sz), pbi_01 = sz, uVar1 == '\0')) {
        (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
      break;
    case (AV1_COMMON *)0xe:
      sz = (AV1Decoder *)
           read_padding(cm_00,(uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (size_t)in_stack_ffffffffffffff28);
      if ((local_10->error).error_code != AOM_CODEC_OK) {
        return -1;
      }
    }
    if (sz <= pbi_01) {
      while (sz < pbi_01) {
        if (local_18[(long)sz] != '\0') {
          (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        in_stack_ffffffffffffff43 = 0;
        sz = (AV1Decoder *)((long)&(sz->dcb).xd.mi_row + 1);
      }
      local_18 = local_18 + (long)&pbi_01->dcb;
      goto LAB_001d301e;
    }
    (local_10->error).error_code = AOM_CODEC_CORRUPT_FRAME;
  }
  return -1;
}

Assistant:

int aom_decode_frame_from_obus(struct AV1Decoder *pbi, const uint8_t *data,
                               const uint8_t *data_end,
                               const uint8_t **p_data_end) {
  AV1_COMMON *const cm = &pbi->common;
  int frame_decoding_finished = 0;
  int is_first_tg_obu_received = 1;
  // Whenever pbi->seen_frame_header is set to 1, frame_header is set to the
  // beginning of the frame_header_obu and frame_header_size is set to its
  // size. This allows us to check if a redundant frame_header_obu is a copy
  // of the previous frame_header_obu.
  //
  // Initialize frame_header to a dummy nonnull pointer, otherwise the Clang
  // Static Analyzer in clang 7.0.1 will falsely warn that a null pointer is
  // passed as an argument to a 'nonnull' parameter of memcmp(). The initial
  // value will not be used.
  const uint8_t *frame_header = data;
  uint32_t frame_header_size = 0;
  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  pbi->seen_frame_header = 0;
  pbi->next_start_tile = 0;
  pbi->num_tile_groups = 0;

  if (data_end < data) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    return -1;
  }

  // Reset pbi->camera_frame_header_ready to 0 if cm->tiles.large_scale = 0.
  if (!cm->tiles.large_scale) pbi->camera_frame_header_ready = 0;

  // decode frame as a series of OBUs
  while (!frame_decoding_finished && pbi->error.error_code == AOM_CODEC_OK) {
    struct aom_read_bit_buffer rb;
    size_t payload_size = 0;
    size_t decoded_payload_size = 0;
    size_t obu_payload_offset = 0;
    size_t bytes_read = 0;
    const size_t bytes_available = data_end - data;

    if (bytes_available == 0 && !pbi->seen_frame_header) {
      *p_data_end = data;
      pbi->error.error_code = AOM_CODEC_OK;
      break;
    }

    aom_codec_err_t status =
        aom_read_obu_header_and_size(data, bytes_available, pbi->is_annexb,
                                     &obu_header, &payload_size, &bytes_read);

    if (status != AOM_CODEC_OK) {
      pbi->error.error_code = status;
      return -1;
    }

    // Record obu size header information.
    pbi->obu_size_hdr.data = data + obu_header.size;
    pbi->obu_size_hdr.size = bytes_read - obu_header.size;

    // Note: aom_read_obu_header_and_size() takes care of checking that this
    // doesn't cause 'data' to advance past 'data_end'.
    data += bytes_read;

    if ((size_t)(data_end - data) < payload_size) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }

    cm->temporal_layer_id = obu_header.temporal_layer_id;
    cm->spatial_layer_id = obu_header.spatial_layer_id;

    if (obu_header.type != OBU_TEMPORAL_DELIMITER &&
        obu_header.type != OBU_SEQUENCE_HEADER) {
      // don't decode obu if it's not in current operating mode
      if (!is_obu_in_current_operating_point(pbi, &obu_header)) {
        data += payload_size;
        continue;
      }
    }

    av1_init_read_bit_buffer(pbi, &rb, data, data + payload_size);

    switch (obu_header.type) {
      case OBU_TEMPORAL_DELIMITER:
        decoded_payload_size = read_temporal_delimiter_obu();
        if (pbi->seen_frame_header) {
          // A new temporal unit has started, but the frame in the previous
          // temporal unit is incomplete.
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        break;
      case OBU_SEQUENCE_HEADER:
        decoded_payload_size = read_sequence_header_obu(pbi, &rb);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        // The sequence header should not change in the middle of a frame.
        if (pbi->sequence_header_changed && pbi->seen_frame_header) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        break;
      case OBU_FRAME_HEADER:
      case OBU_REDUNDANT_FRAME_HEADER:
      case OBU_FRAME:
        if (obu_header.type == OBU_REDUNDANT_FRAME_HEADER) {
          if (!pbi->seen_frame_header) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
        } else {
          // OBU_FRAME_HEADER or OBU_FRAME.
          if (pbi->seen_frame_header) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
        }
        // Only decode first frame header received
        if (!pbi->seen_frame_header ||
            (cm->tiles.large_scale && !pbi->camera_frame_header_ready)) {
          frame_header_size = read_frame_header_obu(
              pbi, &rb, data, p_data_end, obu_header.type != OBU_FRAME);
          frame_header = data;
          pbi->seen_frame_header = 1;
          if (!pbi->ext_tile_debug && cm->tiles.large_scale)
            pbi->camera_frame_header_ready = 1;
        } else {
          // Verify that the frame_header_obu is identical to the original
          // frame_header_obu.
          if (frame_header_size > payload_size ||
              memcmp(data, frame_header, frame_header_size) != 0) {
            pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
            return -1;
          }
          assert(rb.bit_offset == 0);
          rb.bit_offset = 8 * frame_header_size;
        }

        decoded_payload_size = frame_header_size;
        pbi->frame_header_size = frame_header_size;
        cm->cur_frame->temporal_id = obu_header.temporal_layer_id;
        cm->cur_frame->spatial_id = obu_header.spatial_layer_id;

        if (cm->show_existing_frame) {
          if (obu_header.type == OBU_FRAME) {
            pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
            return -1;
          }
          frame_decoding_finished = 1;
          pbi->seen_frame_header = 0;

          if (cm->show_frame &&
              !cm->seq_params->order_hint_info.enable_order_hint) {
            ++cm->current_frame.frame_number;
          }
          break;
        }

        // In large scale tile coding, decode the common camera frame header
        // before any tile list OBU.
        if (!pbi->ext_tile_debug && pbi->camera_frame_header_ready) {
          frame_decoding_finished = 1;
          // Skip the rest of the frame data.
          decoded_payload_size = payload_size;
          // Update data_end.
          *p_data_end = data_end;
          break;
        }

        if (obu_header.type != OBU_FRAME) break;
        obu_payload_offset = frame_header_size;
        // Byte align the reader before reading the tile group.
        // byte_alignment() has set pbi->error.error_code if it returns -1.
        if (byte_alignment(cm, &rb)) return -1;
        AOM_FALLTHROUGH_INTENDED;  // fall through to read tile group.
      case OBU_TILE_GROUP:
        if (!pbi->seen_frame_header) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        if (obu_payload_offset > payload_size) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        decoded_payload_size += read_one_tile_group_obu(
            pbi, &rb, is_first_tg_obu_received, data + obu_payload_offset,
            data + payload_size, p_data_end, &frame_decoding_finished,
            obu_header.type == OBU_FRAME);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        is_first_tg_obu_received = 0;
        if (frame_decoding_finished) {
          pbi->seen_frame_header = 0;
          pbi->next_start_tile = 0;
        }
        pbi->num_tile_groups++;
        break;
      case OBU_METADATA: {
        decoded_payload_size =
            read_metadata(pbi, data, payload_size, obu_header.has_extension);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      }
      case OBU_TILE_LIST:
        if (CONFIG_NORMAL_TILE_MODE) {
          pbi->error.error_code = AOM_CODEC_UNSUP_BITSTREAM;
          return -1;
        }

        // This OBU type is purely for the large scale tile coding mode.
        // The common camera frame header has to be already decoded.
        if (!pbi->camera_frame_header_ready) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }

        cm->tiles.large_scale = 1;
        av1_set_single_tile_decoding_mode(cm);
        decoded_payload_size =
            read_and_decode_one_tile_list(pbi, &rb, data, data + payload_size,
                                          p_data_end, &frame_decoding_finished);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      case OBU_PADDING:
        decoded_payload_size = read_padding(cm, data, payload_size);
        if (pbi->error.error_code != AOM_CODEC_OK) return -1;
        break;
      default:
        // Skip unrecognized OBUs
        if (payload_size > 0 &&
            get_last_nonzero_byte(data, payload_size) == 0) {
          pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
          return -1;
        }
        decoded_payload_size = payload_size;
        break;
    }

    // Check that the signalled OBU size matches the actual amount of data read
    if (decoded_payload_size > payload_size) {
      pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }

    // If there are extra padding bytes, they should all be zero
    while (decoded_payload_size < payload_size) {
      uint8_t padding_byte = data[decoded_payload_size++];
      if (padding_byte != 0) {
        pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
        return -1;
      }
    }

    data += payload_size;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) return -1;
  return frame_decoding_finished;
}